

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool __thiscall
testing::internal::TypedTestSuitePState::AddTestName
          (TypedTestSuitePState *this,char *file,int line,char *case_name,char *test_name)

{
  FILE *__stream;
  undefined8 uVar1;
  allocator local_c9;
  string local_c8;
  CodeLocation local_a8;
  pair<const_char_*,_testing::internal::CodeLocation> local_80;
  string local_50;
  char *local_30;
  char *test_name_local;
  char *case_name_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  TypedTestSuitePState *this_local;
  
  __stream = _stderr;
  local_30 = test_name;
  test_name_local = case_name;
  case_name_local._4_4_ = line;
  pcStack_18 = file;
  file_local = &this->registered_;
  if ((this->registered_ & 1U) != 0) {
    FormatFileLocation_abi_cxx11_
              (&local_50,(internal *)file,(char *)(ulong)(uint)line,(int)case_name);
    uVar1 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s Test %s must be defined before REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
            uVar1,local_30,test_name_local);
    std::__cxx11::string::~string((string *)&local_50);
    fflush(_stderr);
    posix::Abort();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,file,&local_c9);
  CodeLocation::CodeLocation(&local_a8,&local_c8,case_name_local._4_4_);
  std::make_pair<char_const*&,testing::internal::CodeLocation>(&local_80,&local_30,&local_a8);
  std::
  map<std::__cxx11::string,testing::internal::CodeLocation,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
  ::insert<std::pair<char_const*,testing::internal::CodeLocation>>
            ((map<std::__cxx11::string,testing::internal::CodeLocation,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
              *)&this->registered_tests_,&local_80);
  std::pair<const_char_*,_testing::internal::CodeLocation>::~pair(&local_80);
  CodeLocation::~CodeLocation(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return true;
}

Assistant:

bool AddTestName(const char* file, int line, const char* case_name,
                   const char* test_name) {
    if (registered_) {
      fprintf(stderr,
              "%s Test %s must be defined before "
              "REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
              FormatFileLocation(file, line).c_str(), test_name, case_name);
      fflush(stderr);
      posix::Abort();
    }
    registered_tests_.insert(
        ::std::make_pair(test_name, CodeLocation(file, line)));
    return true;
  }